

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O1

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  int iVar2;
  explore_eval *dat;
  option_group_definition *this;
  base_learner *l;
  multi_learner *base;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar3;
  long lVar4;
  undefined **ppuVar5;
  label_parser *plVar6;
  byte bVar7;
  bool explore_eval_option;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  bool local_3a1;
  vw *local_3a0;
  _func_int ***local_398;
  _func_int **local_390;
  _func_int **local_388 [2];
  float *local_378;
  long local_370;
  _func_int ***local_368;
  _func_int **local_360;
  _func_int **local_358 [2];
  option_group_definition local_348;
  long *local_310;
  long local_308;
  long local_300 [2];
  undefined1 local_2f0 [112];
  bool local_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  string local_250;
  string local_230;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<float> local_170;
  typed_option<bool> local_d0;
  
  bVar7 = 0;
  local_3a0 = all;
  dat = calloc_or_throw<EXPLORE_EVAL::explore_eval>(1);
  (dat->known_cost).cost = 0.0;
  (dat->known_cost).action = 0;
  (dat->known_cost).probability = 0.0;
  (dat->known_cost).partial_prediction = 0.0;
  dat->all = (vw *)0x0;
  dat->offset = 0;
  (dat->action_label).costs._begin = (cb_class *)0x0;
  (dat->action_label).costs._end = (cb_class *)0x0;
  (dat->action_label).costs.end_array = (cb_class *)0x0;
  (dat->action_label).costs.erase_count = 0;
  (dat->empty_label).costs._begin = (cb_class *)0x0;
  (dat->empty_label).costs._end = (cb_class *)0x0;
  (dat->empty_label).costs.end_array = (cb_class *)0x0;
  (dat->empty_label).costs.erase_count = 0;
  dat->example_counter = 0;
  dat->update_count = 0;
  dat->violations = 0;
  dat->multiplier = 0.0;
  dat->fixed_multiplier = false;
  *(undefined3 *)&dat->field_0x7d = 0;
  local_3a1 = false;
  local_2f0._0_8_ = (_func_int **)0x12;
  local_398 = local_388;
  local_398 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)local_2f0);
  local_388[0] = (_func_int **)local_2f0._0_8_;
  *(undefined4 *)local_398 = 0x6c707845;
  builtin_strncpy((char *)((long)local_398 + 4),"ore ",4);
  *(undefined4 *)(local_398 + 1) = 0x6c617665;
  builtin_strncpy((char *)((long)local_398 + 0xc),"uati",4);
  *(undefined2 *)(local_398 + 2) = 0x6e6f;
  local_390 = (_func_int **)local_2f0._0_8_;
  *(char *)((long)local_398 + local_2f0._0_8_) = '\0';
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_398,(char *)(local_2f0._0_8_ + (long)local_398));
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  local_230.field_2._M_allocated_capacity = 0x5f65726f6c707865;
  local_230.field_2._8_4_ = 0x6c617665;
  local_230._M_string_length = 0xc;
  local_230.field_2._M_local_buf[0xc] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2f0,&local_230,&local_3a1);
  local_280 = true;
  local_368 = local_358;
  local_210._0_8_ = (_func_int **)0x22;
  local_368 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)local_210);
  local_358[0] = (_func_int **)local_210._0_8_;
  local_368[2] = (_func_int **)0x6461206c6176655f;
  local_368[3] = (_func_int **)0x6963696c6f702066;
  *local_368 = (_func_int **)0x657461756c617645;
  local_368[1] = (_func_int **)0x65726f6c70786520;
  *(undefined2 *)(local_368 + 4) = 0x7365;
  local_360 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_368 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_2f0);
  this = VW::config::option_group_definition::add<bool>(&local_348,&local_d0);
  local_250.field_2._M_allocated_capacity = 0x696c7069746c756d;
  local_250.field_2._8_2_ = 0x7265;
  local_250._M_string_length = 10;
  local_250.field_2._M_local_buf[10] = '\0';
  local_378 = &dat->multiplier;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_210,&local_250,local_378);
  local_370 = 0x3f;
  local_310 = local_300;
  local_310 = (long *)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_370);
  local_300[0] = local_370;
  builtin_strncpy((char *)((long)local_310 + 0x2f),"obabilit",8);
  builtin_strncpy((char *)((long)local_310 + 0x37),"ies <= 1",8);
  local_310[4] = 0x6173206e6f697463;
  local_310[5] = 0x6f727020656c706d;
  local_310[2] = 0x20656b616d206f74;
  local_310[3] = 0x656a6572206c6c61;
  *local_310 = 0x696c7069746c754d;
  local_310[1] = 0x2064657375207265;
  local_308 = local_370;
  *(char *)((long)local_310 + local_370) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_170,(typed_option<float> *)local_210);
  VW::config::option_group_definition::add<float>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_210._0_8_ = &PTR__typed_option_002cbf98;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_2f0._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
  }
  if (local_268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_348);
  if (local_3a1 == false) {
    plVar3 = (learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
  }
  else {
    dat->all = local_3a0;
    pp_Var1 = (_func_int **)(local_2f0 + 0x10);
    local_2f0._16_6_ = 0x7069746c756d;
    local_2f0._22_2_ = 0x696c;
    local_2f0._24_2_ = 0x7265;
    local_2f0._8_8_ = (pointer)0xa;
    local_2f0._26_4_ = local_2f0._26_4_ & 0xffffff00;
    local_2f0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options,local_2f0);
    if ((_func_int **)local_2f0._0_8_ != pp_Var1) {
      operator_delete((void *)local_2f0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      *local_378 = 1.0;
    }
    else {
      dat->fixed_multiplier = true;
    }
    local_2f0._16_6_ = 0x7078655f6263;
    local_2f0._22_2_ = 0x6f6c;
    local_2f0._24_2_ = 0x6572;
    local_2f0._26_4_ = 0x6664615f;
    local_2f0._8_8_ = (pointer)0xe;
    local_2f0[0x1e] = '\0';
    local_2f0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_2f0._0_8_ != pp_Var1) {
      operator_delete((void *)local_2f0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      local_2f0._16_6_ = 0x7078655f6263;
      local_2f0._22_2_ = 0x6f6c;
      local_2f0._24_2_ = 0x6572;
      local_2f0._26_4_ = 0x6664615f;
      local_2f0._8_8_ = (pointer)0xe;
      local_2f0[0x1e] = '\0';
      local_210._8_8_ = (pointer)0x0;
      local_210[0x10] = 0;
      local_2f0._0_8_ = pp_Var1;
      local_210._0_8_ = local_210 + 0x10;
      (*options->_vptr_options_i[5])(options,local_2f0,local_210);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_);
      }
      if ((_func_int **)local_2f0._0_8_ != pp_Var1) {
        operator_delete((void *)local_2f0._0_8_);
      }
    }
    local_3a0->delete_prediction = (_func_void_void_ptr *)0x0;
    l = setup_base(options,local_3a0);
    base = LEARNER::as_multiline<char,char>(l);
    ppuVar5 = &CB::cb_label;
    plVar6 = &local_3a0->p->lp;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      plVar6->default_label = (_func_void_void_ptr *)*ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
      plVar6 = (label_parser *)((long)plVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    local_3a0->label_type = cb;
    plVar3 = LEARNER::
             learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (dat,base,EXPLORE_EVAL::do_actual_learning<true>,
                        EXPLORE_EVAL::do_actual_learning<false>,1,action_probs);
    *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
    *(code **)(plVar3 + 0x68) = EXPLORE_EVAL::finish_multiline_example;
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = EXPLORE_EVAL::finish;
    dat = (explore_eval *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (dat != (explore_eval *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}